

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::KnapsackGroupOutputs
          (CoinsResult *available_coins,CWallet *wallet,CoinEligibilityFilter *filter)

{
  long lVar1;
  int iVar2;
  mapped_type *pmVar3;
  long in_FS_OFFSET;
  initializer_list<wallet::SelectionFilter> __l;
  allocator_type local_179;
  _Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> local_178;
  CoinSelectionParams local_160;
  SelectionFilter local_108;
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  local_e0;
  FastRandomContext rand;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&rand,false);
  local_160.change_output_size = 0;
  local_160.change_spend_size = 0;
  local_160.m_min_change_target = 1000000;
  local_160.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  local_160.m_long_term_feerate.nSatoshisPerK = 0;
  local_160.m_discard_feerate.nSatoshisPerK._0_7_ = 0;
  local_160.m_discard_feerate.nSatoshisPerK._7_1_ = 0;
  local_160.tx_noinputs_size = 0;
  local_160.m_subtract_fee_outputs = false;
  local_160.m_avoid_partial_spends = false;
  local_160.m_include_unsafe_inputs = false;
  local_160.min_viable_change = 0;
  local_160.m_change_fee = 0;
  local_160.m_cost_of_change = 0;
  local_160.m_effective_feerate.nSatoshisPerK = 0;
  local_160.rng_fast = &rand;
  if (KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
      ::static_groups == '\0') {
    iVar2 = __cxa_guard_acquire(&KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
                                 ::static_groups);
    if (iVar2 != 0) {
      KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_color = _S_red;
      KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_parent = (_Base_ptr)0x0;
      KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_left =
           &KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
      _M_header._M_right =
           &KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
            _M_header;
      KnapsackGroupOutputs::static_groups.groups_by_type._M_t._M_impl.super__Rb_tree_header.
      _M_node_count = 0;
      KnapsackGroupOutputs::static_groups.all_groups.positive_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      KnapsackGroupOutputs::static_groups.all_groups.positive_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      KnapsackGroupOutputs::static_groups.all_groups.positive_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      KnapsackGroupOutputs::static_groups.all_groups.mixed_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      KnapsackGroupOutputs::static_groups.all_groups.mixed_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      KnapsackGroupOutputs::static_groups.all_groups.mixed_group.
      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __cxa_atexit(OutputGroupTypeMap::~OutputGroupTypeMap,&KnapsackGroupOutputs::static_groups,
                   &__dso_handle);
      __cxa_guard_release(&KnapsackGroupOutputs(wallet::CoinsResult_const&,wallet::CWallet&,wallet::CoinEligibilityFilter_const&)
                           ::static_groups);
    }
  }
  local_108.filter.conf_mine = filter->conf_mine;
  local_108.filter.conf_theirs = filter->conf_theirs;
  local_108.filter._17_8_ = *(undefined8 *)((long)&filter->max_descendants + 1);
  local_108.filter.max_descendants._0_1_ =
       (undefined1)((ulong)*(undefined8 *)((long)&filter->max_ancestors + 1) >> 0x38);
  local_108.filter.max_ancestors._0_1_ = (undefined1)filter->max_ancestors;
  local_108.filter.max_ancestors._1_7_ = (undefined7)(filter->max_ancestors >> 8);
  local_108.allow_mixed_output_types = true;
  __l._M_len = 1;
  __l._M_array = &local_108;
  std::vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::vector
            ((vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)&local_178
             ,__l,&local_179);
  GroupOutputs((FilteredOutputGroups *)&local_e0,wallet,available_coins,&local_160,
               (vector<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_> *)
               &local_178);
  pmVar3 = std::
           map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
           ::operator[]((map<wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
                         *)&local_e0,filter);
  OutputGroupTypeMap::operator=(&KnapsackGroupOutputs::static_groups,pmVar3);
  std::
  _Rb_tree<wallet::CoinEligibilityFilter,_std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>,_std::_Select1st<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>,_std::less<wallet::CoinEligibilityFilter>,_std::allocator<std::pair<const_wallet::CoinEligibilityFilter,_wallet::OutputGroupTypeMap>_>_>
  ::~_Rb_tree(&local_e0);
  std::_Vector_base<wallet::SelectionFilter,_std::allocator<wallet::SelectionFilter>_>::
  ~_Vector_base(&local_178);
  ChaCha20::~ChaCha20(&rand.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return &KnapsackGroupOutputs::static_groups.all_groups.mixed_group;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<OutputGroup>& KnapsackGroupOutputs(const CoinsResult& available_coins, CWallet& wallet, const CoinEligibilityFilter& filter)
{
    FastRandomContext rand{};
    CoinSelectionParams coin_selection_params{
        rand,
        /*change_output_size=*/ 0,
        /*change_spend_size=*/ 0,
        /*min_change_target=*/ CENT,
        /*effective_feerate=*/ CFeeRate(0),
        /*long_term_feerate=*/ CFeeRate(0),
        /*discard_feerate=*/ CFeeRate(0),
        /*tx_noinputs_size=*/ 0,
        /*avoid_partial=*/ false,
    };
    static OutputGroupTypeMap static_groups;
    static_groups = GroupOutputs(wallet, available_coins, coin_selection_params, {{filter}})[filter];
    return static_groups.all_groups.mixed_group;
}